

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_or__Test::~correctness_or__Test(correctness_or__Test *this)

{
  void *in_RDI;
  
  ~correctness_or__Test((correctness_or__Test *)0x127998);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(correctness, or_)
{
    big_integer a = 0x55;
    big_integer b = 0xaa;

    EXPECT_TRUE((a | b) == 0xff);
    a |= b;
    EXPECT_TRUE(a == 0xff);

    big_integer c = 0x55;
    big_integer d = 0xcc;
    EXPECT_EQ(big_integer(0xdd), c | d);
}